

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O1

bool __thiscall
QXmlStreamWriterPrivate::finishStartElement(QXmlStreamWriterPrivate *this,bool contents)

{
  ushort uVar1;
  Tag *pTVar2;
  long lVar3;
  qsizetype qVar4;
  long lVar5;
  size_t in_RCX;
  undefined7 in_register_00000031;
  
  uVar1 = *(ushort *)&this->field_0x78;
  *(ushort *)&this->field_0x78 =
       uVar1 & 0xffef | (ushort)((int)CONCAT71(in_register_00000031,contents) << 4);
  if ((uVar1 & 2) != 0) {
    if ((uVar1 & 4) == 0) {
      write(this,0x58e3db,(void *)0x1,in_RCX);
    }
    else {
      write(this,0x58e274,(void *)0x2,in_RCX);
      pTVar2 = (this->super_QXmlStreamPrivateTagStack).tagStack.data;
      lVar3 = (this->super_QXmlStreamPrivateTagStack).tagStack.tos;
      qVar4 = pTVar2[lVar3].tagStackStringStorageSize;
      lVar5 = pTVar2[lVar3].namespaceDeclarationsSize;
      (this->super_QXmlStreamPrivateTagStack).tagStack.tos = lVar3 + -1;
      (this->super_QXmlStreamPrivateTagStack).tagStackStringStorageSize = qVar4;
      (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos = lVar5 + -1;
      (this->super_QXmlStreamPrivateTagStack).tagsDone = lVar3 < 1;
      this->lastNamespaceDeclaration = lVar5;
      this->field_0x78 = this->field_0x78 & 0xf7;
    }
    this->lastNamespaceDeclaration =
         (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos + 1;
    *(ushort *)&this->field_0x78 = (ushort)*(undefined4 *)&this->field_0x78 & 0xfff9 | 0x200;
  }
  return SUB41((uVar1 & 0x10) >> 4,0);
}

Assistant:

bool QXmlStreamWriterPrivate::finishStartElement(bool contents)
{
    bool hadSomethingWritten = wroteSomething;
    wroteSomething = contents;
    if (!inStartElement)
        return hadSomethingWritten;

    if (inEmptyElement) {
        write("/>");
        QXmlStreamWriterPrivate::Tag tag = tagStack_pop();
        lastNamespaceDeclaration = tag.namespaceDeclarationsSize;
        lastWasStartElement = false;
    } else {
        write(">");
    }
    inStartElement = inEmptyElement = false;
    lastNamespaceDeclaration = namespaceDeclarations.size();
    didWriteAnyToken = true;
    return hadSomethingWritten;
}